

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O3

void pub_read_record(ESF_Data *newdata,char *buf)

{
  uint uVar1;
  Type TVar2;
  TargetRestrict TVar3;
  Target TVar4;
  
  uVar1 = PacketProcessor::Number(*buf,buf[1],0xfe,0xfe);
  newdata->icon = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[2],buf[3],0xfe,0xfe);
  newdata->graphic = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[4],buf[5],0xfe,0xfe);
  newdata->tp = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[6],buf[7],0xfe,0xfe);
  newdata->sp = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[8],0xfe,0xfe,0xfe);
  newdata->cast_time = (uchar)uVar1;
  TVar2 = PacketProcessor::Number(buf[0xb],0xfe,0xfe,0xfe);
  newdata->type = TVar2;
  TVar3 = PacketProcessor::Number(buf[0x11],0xfe,0xfe,0xfe);
  newdata->target_restrict = TVar3;
  TVar4 = PacketProcessor::Number(buf[0x12],0xfe,0xfe,0xfe);
  newdata->target = TVar4;
  uVar1 = PacketProcessor::Number(buf[0x17],buf[0x18],0xfe,0xfe);
  newdata->mindam = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x19],buf[0x1a],0xfe,0xfe);
  newdata->maxdam = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x1b],buf[0x1c],0xfe,0xfe);
  newdata->accuracy = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x22],buf[0x23],0xfe,0xfe);
  newdata->hp = (short)uVar1;
  return;
}

Assistant:

void pub_read_record(ESF_Data& newdata, char* buf)
{
	newdata.icon = PacketProcessor::Number(buf[0], buf[1]);
	newdata.graphic = PacketProcessor::Number(buf[2], buf[3]);
	newdata.tp = PacketProcessor::Number(buf[4], buf[5]);
	newdata.sp = PacketProcessor::Number(buf[6], buf[7]);
	newdata.cast_time = PacketProcessor::Number(buf[8]);

	newdata.type = static_cast<ESF::Type>(PacketProcessor::Number(buf[11]));
	newdata.target_restrict = static_cast<ESF::TargetRestrict>(PacketProcessor::Number(buf[17]));
	newdata.target = static_cast<ESF::Target>(PacketProcessor::Number(buf[18]));

	newdata.mindam = PacketProcessor::Number(buf[23], buf[24]);
	newdata.maxdam = PacketProcessor::Number(buf[25], buf[26]);
	newdata.accuracy = PacketProcessor::Number(buf[27], buf[28]);
	newdata.hp = PacketProcessor::Number(buf[34], buf[35]);
}